

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyMap.cpp
# Opt level: O1

vector<std::shared_ptr<OpenMD::GenericData>,_std::allocator<std::shared_ptr<OpenMD::GenericData>_>_>
* __thiscall
OpenMD::PropertyMap::getProperties
          (vector<std::shared_ptr<OpenMD::GenericData>,_std::allocator<std::shared_ptr<OpenMD::GenericData>_>_>
           *__return_storage_ptr__,PropertyMap *this)

{
  _Rb_tree_node_base *p_Var1;
  
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<OpenMD::GenericData>,_std::allocator<std::shared_ptr<OpenMD::GenericData>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<OpenMD::GenericData>,_std::allocator<std::shared_ptr<OpenMD::GenericData>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<OpenMD::GenericData>,_std::allocator<std::shared_ptr<OpenMD::GenericData>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (p_Var1 = (this->propMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->propMap_)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    std::
    vector<std::shared_ptr<OpenMD::GenericData>,_std::allocator<std::shared_ptr<OpenMD::GenericData>_>_>
    ::push_back(__return_storage_ptr__,(value_type *)(p_Var1 + 2));
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::shared_ptr<GenericData>> PropertyMap::getProperties() {
    std::vector<std::shared_ptr<GenericData>> properties;
    std::map<std::string, std::shared_ptr<GenericData>>::iterator iter;

    for (iter = propMap_.begin(); iter != propMap_.end(); ++iter)
      properties.push_back(iter->second);

    return properties;
  }